

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O1

Token __thiscall slang::parsing::Preprocessor::expect(Preprocessor *this,TokenKind kind)

{
  Token *pTVar1;
  undefined2 uVar2;
  BumpAllocator *alloc;
  Diagnostics *diagnostics;
  Info *pIVar3;
  Token lastConsumed;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  Token TVar7;
  Token TVar8;
  Token local_50;
  Token local_40;
  
  if ((this->currentToken).info == (Info *)0x0) {
    TVar7 = nextProcessed(this);
    this->currentToken = TVar7;
  }
  pTVar1 = &this->currentToken;
  uVar2 = pTVar1->kind;
  TVar8 = *pTVar1;
  TVar7 = *pTVar1;
  if (uVar2 == kind) {
    pTVar1 = &this->currentToken;
    uVar4 = pTVar1->field_0x2;
    NVar5.raw = (pTVar1->numFlags).raw;
    uVar6 = pTVar1->rawLen;
    pIVar3 = (this->currentToken).info;
    (this->lastConsumed).kind = pTVar1->kind;
    (this->lastConsumed).field_0x2 = uVar4;
    (this->lastConsumed).numFlags = (NumericTokenFlags)NVar5.raw;
    (this->lastConsumed).rawLen = uVar6;
    (this->lastConsumed).info = pIVar3;
    Token::Token(&local_50);
    pTVar1->kind = local_50.kind;
    pTVar1->field_0x2 = local_50._2_1_;
    pTVar1->numFlags = (NumericTokenFlags)local_50.numFlags.raw;
    pTVar1->rawLen = local_50.rawLen;
    (this->currentToken).info = local_50.info;
  }
  else {
    alloc = this->alloc;
    diagnostics = this->diagnostics;
    lastConsumed = this->lastConsumed;
    Token::Token(&local_40);
    TVar8.info = local_40.info;
    TVar8.kind = local_40.kind;
    TVar8._2_1_ = local_40._2_1_;
    TVar8.numFlags.raw = local_40.numFlags.raw;
    TVar8.rawLen = local_40.rawLen;
    TVar8 = Token::createExpected(alloc,diagnostics,TVar7,kind,lastConsumed,TVar8);
  }
  return TVar8;
}

Assistant:

Token Preprocessor::expect(TokenKind kind) {
    auto result = peek();
    if (result.kind != kind)
        return Token::createExpected(alloc, diagnostics, result, kind, lastConsumed, Token());

    lastConsumed = currentToken;
    currentToken = Token();
    return result;
}